

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSLEDPrivateKey.cpp
# Opt level: O3

ByteString * __thiscall
OSSLEDPrivateKey::PKCS8Encode(ByteString *__return_storage_ptr__,OSSLEDPrivateKey *this)

{
  uint uVar1;
  PKCS8_PRIV_KEY_INFO *a;
  EVP_PKEY *pkey;
  uchar *p;
  uchar *local_18;
  
  ByteString::ByteString(__return_storage_ptr__);
  pkey = (EVP_PKEY *)this->pkey;
  if (pkey == (EVP_PKEY *)0x0) {
    createOSSLKey(this);
    pkey = (EVP_PKEY *)this->pkey;
    if (pkey == (EVP_PKEY *)0x0) {
      return __return_storage_ptr__;
    }
  }
  a = EVP_PKEY2PKCS8(pkey);
  if (a != (PKCS8_PRIV_KEY_INFO *)0x0) {
    uVar1 = i2d_PKCS8_PRIV_KEY_INFO(a,(uchar **)0x0);
    if ((int)uVar1 < 1) {
      PKCS8_PRIV_KEY_INFO_free(a);
    }
    else {
      ByteString::resize(__return_storage_ptr__,(ulong)uVar1);
      local_18 = ByteString::operator[](__return_storage_ptr__,0);
      i2d_PKCS8_PRIV_KEY_INFO(a,&local_18);
      PKCS8_PRIV_KEY_INFO_free(a);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

ByteString OSSLEDPrivateKey::PKCS8Encode()
{
	ByteString der;
	EVP_PKEY* key = getOSSLKey();
	if (key == NULL) return der;
	PKCS8_PRIV_KEY_INFO* p8 = EVP_PKEY2PKCS8(key);
	if (p8 == NULL) return der;
	int len = i2d_PKCS8_PRIV_KEY_INFO(p8, NULL);
	if (len <= 0)
	{
		PKCS8_PRIV_KEY_INFO_free(p8);
		return der;
	}
	der.resize(len);
	unsigned char* p = &der[0];
	i2d_PKCS8_PRIV_KEY_INFO(p8, &p);
	PKCS8_PRIV_KEY_INFO_free(p8);
	return der;
}